

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum_core.cpp
# Opt level: O2

mbedtls_mpi_uint
mbedtls_mpi_core_sub(mbedtls_mpi_uint *X,mbedtls_mpi_uint *A,mbedtls_mpi_uint *B,size_t limbs)

{
  size_t i;
  ulong uVar1;
  mbedtls_mpi_uint mVar2;
  
  mVar2 = 0;
  for (i = 0; limbs != i; i = i + 1) {
    uVar1 = A[i] - mVar2;
    mVar2 = (ulong)(uVar1 < B[i]) + (ulong)(A[i] < mVar2);
    X[i] = uVar1 - B[i];
  }
  return mVar2;
}

Assistant:

mbedtls_mpi_uint mbedtls_mpi_core_sub(mbedtls_mpi_uint *X,
                                      const mbedtls_mpi_uint *A,
                                      const mbedtls_mpi_uint *B,
                                      size_t limbs)
{
    mbedtls_mpi_uint c = 0;

    for (size_t i = 0; i < limbs; i++) {
        mbedtls_mpi_uint z = (A[i] < c);
        mbedtls_mpi_uint t = A[i] - c;
        c = (t < B[i]) + z;
        X[i] = t - B[i];
    }

    return c;
}